

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FeatureSetDefaults::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FeatureSetDefaults **v1;
  FeatureSetDefaults **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *other;
  uint32_t *puVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  FeatureSetDefaults *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FeatureSetDefaults *from;
  FeatureSetDefaults *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (FeatureSetDefaults *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (FeatureSetDefaults *)to_msg;
  _this = (FeatureSetDefaults *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FeatureSetDefaults_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FeatureSetDefaults*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FeatureSetDefaults_const*,google::protobuf::FeatureSetDefaults*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    this = _internal_mutable_defaults(from);
    other = _internal_defaults((FeatureSetDefaults *)absl_log_internal_check_op_result);
    RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::MergeFrom
              (this,other);
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar3;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.minimum_edition_ = *(int *)(absl_log_internal_check_op_result + 0x30)
        ;
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.maximum_edition_ = *(int *)(absl_log_internal_check_op_result + 0x34)
        ;
      }
    }
    puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x3822,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void FeatureSetDefaults::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSetDefaults*>(&to_msg);
  auto& from = static_cast<const FeatureSetDefaults&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSetDefaults)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_defaults()->MergeFrom(
      from._internal_defaults());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.minimum_edition_ = from._impl_.minimum_edition_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.maximum_edition_ = from._impl_.maximum_edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}